

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool IsCompileableFile(string *ext)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  allocator local_e6;
  allocator local_e5;
  allocator local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(local_e0,".c",&local_e1);
      std::__cxx11::string::string(local_c0,".C",&local_e2);
      std::__cxx11::string::string(local_a0,".cc",&local_e3);
      std::__cxx11::string::string(local_80,".cpp",&local_e4);
      std::__cxx11::string::string(local_60,".m",&local_e5);
      std::__cxx11::string::string(local_40,".mm",&local_e6);
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_,local_e0,
                 &stack0xffffffffffffffe0,0,&local_e7,&local_e8,&local_e9);
      lVar3 = 0xa0;
      do {
        std::__cxx11::string::~string(local_e0 + lVar3);
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  sVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_._M_h,ext);
  return sVar2 != 0;
}

Assistant:

bool IsCompileableFile(const std::string& ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm" };
    return exts.count(ext) > 0;
}